

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpheaders.cpp
# Opt level: O3

QByteArrayView __thiscall
QHttpHeaders::value(QHttpHeaders *this,WellKnownHeader name,QByteArrayView defaultValue)

{
  QHttpHeadersPrivate *this_00;
  QByteArrayView QVar1;
  storage_type *psVar3;
  storage_type *extraout_RDX;
  long in_FS_OFFSET;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  anon_class_1_0_00000001 local_41;
  _Variadic_union<QHttpHeaders::WellKnownHeader,_QByteArray> local_40;
  char local_28;
  long local_20;
  qsizetype qVar2;
  storage_type *psVar4;
  
  psVar4 = defaultValue.m_data;
  psVar3 = (storage_type *)defaultValue.m_size;
  QVar1.m_data = psVar3;
  QVar1.m_size = (qsizetype)psVar3;
  QVar5.m_data = psVar3;
  QVar5.m_size = (qsizetype)psVar3;
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->d).d.ptr;
  if ((this_00 != (QHttpHeadersPrivate *)0x0) && (QVar5 = QVar1, (this_00->headers).d.size != 0)) {
    local_28 = '\0';
    local_40._M_first._M_storage = (_Uninitialized<QHttpHeaders::WellKnownHeader,_true>)name;
    QVar5 = QHttpHeadersPrivate::value(this_00,(HeaderName *)&local_40._M_first,defaultValue);
    psVar4 = QVar5.m_data;
    qVar2 = QVar5.m_size;
    if ((long)local_28 != -1) {
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<QHttpHeaders::WellKnownHeader,_QByteArray>_&>
        ::_S_vtable._M_arr[local_28]._M_data)
                (&local_41,(variant<QHttpHeaders::WellKnownHeader,_QByteArray> *)&local_40);
      QVar5.m_data = extraout_RDX;
      QVar5.m_size = qVar2;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    QVar6.m_data = psVar4;
    QVar6.m_size = QVar5.m_size;
    return QVar6;
  }
  __stack_chk_fail();
}

Assistant:

const noexcept
{
    if (isEmpty())
        return defaultValue;

    return d->value(HeaderName{name}, defaultValue);
}